

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_manager.cpp
# Opt level: O0

void __thiscall cfdcore_manager_Initialize_Test::TestBody(cfdcore_manager_Initialize_Test *this)

{
  bool bVar1;
  AssertHelper local_68;
  Message local_60 [2];
  CfdException *anon_var_0;
  char *pcStack_48;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  CfdCoreHandle *p_handle;
  Message local_30 [3];
  void *local_18;
  CfdCoreHandle handle_;
  cfdcore_manager_Initialize_Test *this_local;
  
  local_18 = (void *)0x0;
  handle_ = this;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Initialize(&local_18);
    }
  }
  else {
    testing::Message::Message(local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&p_handle,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_manager.cpp"
               ,0x28,
               "Expected: (Initialize(&handle_)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&p_handle,local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p_handle);
    testing::Message::~Message(local_30);
  }
  gtest_msg.value = (char *)0x0;
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffffb8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffffb8);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Initialize((void **)gtest_msg.value);
    }
    if ((anon_var_0._7_1_ & 1) != 0) {
      return;
    }
    pcStack_48 = 
    "Expected: (Initialize(p_handle)) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_60);
  testing::internal::AssertHelper::AssertHelper
            (&local_68,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_manager.cpp"
             ,0x2b,pcStack_48);
  testing::internal::AssertHelper::operator=(&local_68,local_60);
  testing::internal::AssertHelper::~AssertHelper(&local_68);
  testing::Message::~Message(local_60);
  return;
}

Assistant:

TEST(cfdcore_manager, Initialize) {
  // 確保したハンドルはプロセス終了時に自動解放させる
  CfdCoreHandle  handle_ = nullptr;
  EXPECT_NO_THROW((Initialize(&handle_)));
  // error
  CfdCoreHandle* p_handle = nullptr;
  EXPECT_THROW((Initialize(p_handle)), CfdException);
}